

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void kratos::MixedAssignmentVisitor::checkout_assignment(Generator *generator,string *name)

{
  Stmt *stmt;
  long lVar1;
  _func_int **pp_Var2;
  StmtException *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  int iVar3;
  int iVar4;
  long *plVar5;
  bool bVar6;
  string_view format_str;
  format_args args;
  string local_a0;
  const_iterator local_80;
  const_iterator local_78;
  size_type sStack_70;
  pointer local_68;
  size_type sStack_60;
  undefined1 local_58 [16];
  undefined1 auStack_48 [8];
  vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> stmt_list;
  
  Generator::get_var((Generator *)local_58,(string *)generator);
  lVar1 = (**(code **)(*(_func_int **)local_58._0_8_ + 0x80))();
  plVar5 = *(long **)(lVar1 + 0x10);
  if (plVar5 != (long *)0x0) {
    iVar3 = 2;
    do {
      pp_Var2 = (_func_int **)(**(code **)(**(long **)(plVar5[1] + 0xc0) + 0x148))();
      if (pp_Var2 == (_func_int **)local_58._0_8_) {
        iVar4 = *(int *)(plVar5[1] + 0xd0);
        if ((iVar3 != 2) && (bVar6 = iVar3 != iVar4, iVar4 = iVar3, bVar6)) {
          auStack_48 = (undefined1  [8])0x0;
          stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          lVar1 = (**(code **)(*(_func_int **)local_58._0_8_ + 0x80))();
          std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::reserve
                    ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)auStack_48,
                     *(size_type *)(lVar1 + 0x18));
          lVar1 = (**(code **)(*(_func_int **)local_58._0_8_ + 0x80))();
          plVar5 = *(long **)(lVar1 + 0x10);
          if (plVar5 != (long *)0x0) {
            do {
              local_78._M_current = (Stmt **)plVar5[1];
              std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>::
              emplace_back<kratos::AssignStmt*>
                        ((vector<kratos::Stmt*,std::allocator<kratos::Stmt*>> *)auStack_48,
                         (AssignStmt **)&local_78);
              plVar5 = (long *)*plVar5;
            } while (plVar5 != (long *)0x0);
          }
          this = (StmtException *)__cxa_allocate_exception(0x10);
          local_78._M_current = (Stmt **)(generator->name)._M_dataplus._M_p;
          sStack_70 = (generator->name)._M_string_length;
          local_68 = (name->_M_dataplus)._M_p;
          sStack_60 = name->_M_string_length;
          format_str.size_ = 0xdd;
          format_str.data_ = (char *)0x2e;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_78;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_a0,(detail *)"Mixed assignment detected for variable {0}.{1}",format_str
                     ,args);
          local_78._M_current = (Stmt **)auStack_48;
          local_80._M_current =
               stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl
               .super__Vector_impl_data._M_start;
          StmtException::StmtException(this,&local_a0,&local_78,&local_80);
          __cxa_throw(this,&StmtException::typeinfo,std::runtime_error::~runtime_error);
        }
        stmt = (Stmt *)plVar5[1];
        check_var_parent(generator,(Var *)stmt[1].super_IRNode._vptr_IRNode,
                         (Var *)stmt[1].super_IRNode.fn_name_ln.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,stmt);
        iVar3 = iVar4;
      }
      plVar5 = (long *)*plVar5;
    } while (plVar5 != (long *)0x0);
  }
  if ((pointer)local_58._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  return;
}

Assistant:

static void checkout_assignment(Generator* generator, const std::string& name) {
        auto const& var = generator->get_var(name);
        AssignmentType type = AssignmentType::Undefined;
        for (auto const& stmt : var->sources()) {
            if (stmt->left()->get_var_root_parent() != var.get()) continue;
            if (type == AssignmentType ::Undefined)
                type = stmt->assign_type();
            else if (type != stmt->assign_type()) {
                std::vector<Stmt*> stmt_list;
                stmt_list.reserve(var->sources().size());
                for (const auto& st : var->sources()) stmt_list.emplace_back(st.get());
                throw StmtException(::format("Mixed assignment detected for variable {0}.{1}",
                                             generator->name, name),
                                    stmt_list.begin(), stmt_list.end());
            }
            // check assignment
            check_var_parent(generator, stmt->left(), stmt->right(), stmt.get());
        }
    }